

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

ProjectedBBox * deqp::gles31::Functional::anon_unknown_1::projectBoundingBox(BoundingBox *bbox)

{
  int i;
  long lVar1;
  float *in_RDI;
  ProjectedBBox *retVal;
  uint uVar2;
  float fVar3;
  float fVar4;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 local_20;
  float local_18;
  undefined8 local_10;
  float local_8;
  
  fVar3 = (bbox->min).m_data[3];
  fVar4 = (bbox->max).m_data[3];
  fVar3 = (float)(~-(uint)(fVar3 <= 0.0) & (uint)fVar3);
  lVar1 = 0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  local_10 = *(undefined8 *)(bbox->min).m_data;
  local_8 = (bbox->min).m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  do {
    res.m_data[lVar1] = *(float *)((long)&local_10 + lVar1 * 4) / fVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar4 = (float)(~-(uint)(fVar4 <= 0.0) & (uint)fVar4);
  local_20 = local_10;
  local_18 = local_8;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = *(float *)((long)&local_20 + lVar1 * 4) / fVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    uVar2 = -(uint)(res.m_data[lVar1] <= res_1.m_data[lVar1]);
    res_2.m_data[lVar1] =
         (float)(~uVar2 & (uint)res_1.m_data[lVar1] | (uint)res.m_data[lVar1] & uVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  in_RDI[2] = res_2.m_data[2];
  *(undefined8 *)in_RDI = res_2.m_data._0_8_;
  local_10 = *(undefined8 *)(bbox->max).m_data;
  local_8 = (bbox->max).m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = *(float *)((long)&local_10 + lVar1 * 4) / fVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_20 = local_10;
  local_18 = local_8;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = *(float *)((long)&local_20 + lVar1 * 4) / fVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    uVar2 = -(uint)(res_1.m_data[lVar1] <= res.m_data[lVar1]);
    res_2.m_data[lVar1] =
         (float)(~uVar2 & (uint)res_1.m_data[lVar1] | (uint)res.m_data[lVar1] & uVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  in_RDI[5] = res_2.m_data[2];
  *(undefined8 *)(in_RDI + 3) = res_2.m_data._0_8_;
  return (ProjectedBBox *)res_2.m_data._0_8_;
}

Assistant:

T						w			(void) const { DE_STATIC_ASSERT(Size >= 4); return m_data[3]; }